

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

wstring * __thiscall
PDA::Transducer::Generator::pop_abi_cxx11_
          (wstring *__return_storage_ptr__,Generator *this,Register *dest,wchar_t suff)

{
  wchar_t local_6c;
  wstring local_50;
  allocator<wchar_t> local_1e;
  undefined1 local_1d;
  wchar_t local_1c;
  Generator *pGStack_18;
  wchar_t suff_local;
  Register *dest_local;
  wstring *result;
  
  local_1c = (wchar_t)dest;
  local_1d = 0;
  pGStack_18 = this;
  dest_local = (Register *)__return_storage_ptr__;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"pop",&local_1e);
  std::allocator<wchar_t>::~allocator(&local_1e);
  if (local_1c == L'\0') {
    local_6c = registerSuffix((Register *)pGStack_18);
  }
  else {
    local_6c = local_1c;
  }
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,local_6c);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,L'\t');
  Register::toString_abi_cxx11_(&local_50,(Register *)pGStack_18);
  std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,(wstring *)&local_50);
  std::__cxx11::wstring::~wstring((wstring *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::pop(const Register &dest, const wchar_t suff)
{
    std::wstring result = L"pop";
    result += suff == L'\0' ? registerSuffix(dest) : suff;
    result += L'\t';
    result += dest.toString();
    return result;
}